

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O0

void __thiscall
Assimp::StreamWriter<false,_false>::Put<char>(StreamWriter<false,_false> *this,char f)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  void *dest;
  StreamWriter<false,_false> *pSStack_10;
  char f_local;
  StreamWriter<false,_false> *this_local;
  
  dest._7_1_ = f;
  pSStack_10 = this;
  Intern::Getter<false,_char,_false>::operator()
            ((Getter<false,_char,_false> *)((long)&dest + 6),(char *)((long)&dest + 7),
             (bool)(this->le & 1));
  sVar1 = this->cursor;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
  if (sVar2 <= sVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->buffer,this->cursor + 1);
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->buffer,this->cursor);
  *pvVar3 = dest._7_1_;
  this->cursor = this->cursor + 1;
  return;
}

Assistant:

void Put(T f)   {
        Intern :: Getter<SwapEndianess,T,RuntimeSwitch>() (&f, le);

        if (cursor + sizeof(T) >= buffer.size()) {
            buffer.resize(cursor + sizeof(T));
        }

        void* dest = &buffer[cursor];

        // reinterpret_cast + assignment breaks strict aliasing rules
        // and generally causes trouble on platforms such as ARM that
        // do not silently ignore alignment faults.
        ::memcpy(dest, &f, sizeof(T));
        cursor += sizeof(T);
    }